

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O3

void __thiscall Varnode::printCover(Varnode *this,ostream *s)

{
  LowlevelError *this_00;
  string local_40;
  
  if (this->cover == (Cover *)0x0) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"No cover to print","");
    LowlevelError::LowlevelError(this_00,&local_40);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if ((this->flags & 0x2000000) == 0) {
    Cover::print(this->cover,s);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"Cover is dirty",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
  std::ostream::put((char)s);
  std::ostream::flush();
  return;
}

Assistant:

void Varnode::printCover(ostream &s) const

{
  if (cover == (Cover *)0)
    throw LowlevelError("No cover to print");
  if ((flags & Varnode::coverdirty)!=0)
    s << "Cover is dirty" << endl;
  else
    cover->print(s);
}